

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

void Gia_ResbFree(Gia_ResbMan_t *p)

{
  int *piVar1;
  Vec_Wrd_t *__ptr;
  word *__ptr_00;
  Vec_Ptr_t *__ptr_01;
  void **__ptr_02;
  Vec_Wec_t *__ptr_03;
  void *__ptr_04;
  int iVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  long lVar5;
  
  pVVar3 = p->vUnateLits[0];
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vUnateLits[1];
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vNotUnateVars[0];
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vNotUnateVars[1];
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vUnatePairs[0];
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vUnatePairs[1];
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vUnateLitsW[0];
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vUnateLitsW[1];
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vUnatePairsW[0];
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vUnatePairsW[1];
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vBinateVars;
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  pVVar3 = p->vGates;
  piVar1 = pVVar3->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar3);
  __ptr = p->vSims;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (word *)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  __ptr_01 = p->vDivs;
  __ptr_02 = __ptr_01->pArray;
  if (__ptr_02 != (void **)0x0) {
    free(__ptr_02);
  }
  free(__ptr_01);
  __ptr_03 = p->vSorter;
  iVar2 = __ptr_03->nCap;
  pVVar3 = __ptr_03->pArray;
  if (iVar2 < 1) {
    if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_0079ae5f;
  }
  else {
    lVar5 = 8;
    lVar4 = 0;
    do {
      __ptr_04 = *(void **)((long)&pVVar3->nCap + lVar5);
      if (__ptr_04 != (void *)0x0) {
        free(__ptr_04);
        pVVar3 = __ptr_03->pArray;
        *(undefined8 *)((long)&pVVar3->nCap + lVar5) = 0;
        iVar2 = __ptr_03->nCap;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < iVar2);
  }
  free(pVVar3);
LAB_0079ae5f:
  free(__ptr_03);
  if (p->pSets[0] != (word *)0x0) {
    free(p->pSets[0]);
    p->pSets[0] = (word *)0x0;
  }
  if (p->pSets[1] != (word *)0x0) {
    free(p->pSets[1]);
    p->pSets[1] = (word *)0x0;
  }
  if (p->pDivA != (word *)0x0) {
    free(p->pDivA);
    p->pDivA = (word *)0x0;
  }
  if (p->pDivB != (word *)0x0) {
    free(p->pDivB);
  }
  free(p);
  return;
}

Assistant:

void Gia_ResbFree( Gia_ResbMan_t * p )
{
    Vec_IntFree( p->vUnateLits[0]    );
    Vec_IntFree( p->vUnateLits[1]    );
    Vec_IntFree( p->vNotUnateVars[0] );
    Vec_IntFree( p->vNotUnateVars[1] );
    Vec_IntFree( p->vUnatePairs[0]   );
    Vec_IntFree( p->vUnatePairs[1]   );
    Vec_IntFree( p->vUnateLitsW[0]   );
    Vec_IntFree( p->vUnateLitsW[1]   );
    Vec_IntFree( p->vUnatePairsW[0]  );
    Vec_IntFree( p->vUnatePairsW[1]  );
    Vec_IntFree( p->vBinateVars      );
    Vec_IntFree( p->vGates           );
    Vec_WrdFree( p->vSims            );
    Vec_PtrFree( p->vDivs            );
    Vec_WecFree( p->vSorter          );
    ABC_FREE( p->pSets[0] );
    ABC_FREE( p->pSets[1] );
    ABC_FREE( p->pDivA );
    ABC_FREE( p->pDivB );
    ABC_FREE( p );
}